

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O0

void __thiscall
ktx::ValidationContext::
error<unsigned_int&,char_const(&)[19],int,std::__cxx11::string,char_const(&)[106]>
          (ValidationContext *this,IssueError *issue,uint *args,char (*args_1) [19],int *args_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3,
          char (*args_4) [106])

{
  basic_string_view<char,_std::char_traits<char>_> s;
  underlying_type_t<ktx::ReturnCode> uVar1;
  char (*args_4_00) [106];
  size_type in_RCX;
  size_type in_RDX;
  undefined1 *in_RSI;
  ValidationReport *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined1 in_stack_00000078 [16];
  string_view in_stack_00000088;
  ValidationReport *__args;
  string *psVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3_00;
  int *in_stack_fffffffffffffe38;
  allocator<char> *in_stack_fffffffffffffe40;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a1;
  ValidationReport VStack_178;
  undefined1 local_128 [88];
  undefined8 local_d0;
  undefined1 *local_c8;
  undefined8 local_a8;
  string local_a0;
  ValidationReport *local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_38;
  undefined8 *local_30;
  undefined1 *local_28;
  undefined8 local_20;
  undefined8 *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  *(int *)&(in_RDI->details)._M_string_length = (int)(in_RDI->details)._M_string_length + 1;
  VStack_178.message.field_2._8_8_ = in_R9;
  VStack_178.details._0_8_ = in_R8;
  VStack_178.details._M_string_length = in_RCX;
  VStack_178.details.field_2._M_allocated_capacity = in_RDX;
  VStack_178.details.field_2._8_8_ = in_RSI;
  uVar1 = ktx::operator+(SUCCESS);
  *(underlying_type_t<ktx::ReturnCode> *)&(in_RDI->details).field_0x4 = uVar1;
  psVar2 = &in_RDI->message;
  local_1a1._1_1_ = *(undefined1 *)VStack_178.details.field_2._8_8_;
  local_1a1._3_2_ = *(undefined2 *)(VStack_178.details.field_2._8_8_ + 2);
  pcVar3 = (char *)((long)&local_1a1._M_string_length + 1);
  args_4_00 = (char (*) [106])(VStack_178.details.field_2._8_8_ + 8);
  args_3_00 = &local_1a1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  __args = &VStack_178;
  local_60 = (undefined8 *)(VStack_178.details.field_2._8_8_ + 0x18);
  local_58 = &stack0xfffffffffffffe38;
  local_70 = *local_60;
  local_68 = *(undefined8 *)(VStack_178.details.field_2._8_8_ + 0x20);
  s._M_str = pcVar3;
  s._M_len = (size_t)psVar2;
  ::fmt::v10::basic_string_view<char>::
  basic_string_view<std::basic_string_view<char,_std::char_traits<char>_>,_0>
            ((basic_string_view<char> *)in_RDI,s);
  local_8 = local_60;
  local_a0.field_2._M_allocated_capacity = VStack_178.details.field_2._M_allocated_capacity;
  local_a0._M_string_length = VStack_178.details._M_string_length;
  local_a0._M_dataplus = VStack_178.details._M_dataplus;
  local_a0._1_7_ = VStack_178.details._1_7_;
  local_a8 = VStack_178.message.field_2._8_8_;
  local_50 = (undefined1 *)((long)&local_a0.field_2 + 8);
  local_78 = __args;
  ::fmt::v10::
  make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int,char_const[19],int,std::__cxx11::string,char_const[106]>
            ((uint *)in_stack_fffffffffffffe48,(char (*) [19])in_stack_fffffffffffffe40,
             in_stack_fffffffffffffe38,args_3_00,args_4_00);
  local_30 = &local_d0;
  local_38 = local_128;
  local_20 = 0xcd1c2;
  local_d0 = 0xcd1c2;
  local_28 = local_38;
  local_18 = local_30;
  local_10 = local_38;
  local_c8 = local_38;
  ::fmt::v10::vformat_abi_cxx11_(in_stack_00000088,(format_args)in_stack_00000078);
  std::function<void_(const_ktx::ValidationReport_&)>::operator()
            ((function<void_(const_ktx::ValidationReport_&)> *)in_RDI,__args);
  ValidationReport::~ValidationReport(in_RDI);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  return;
}

Assistant:

void error(const IssueError& issue, Args&&... args) {
        ++numError;
        returnCode = +rc::INVALID_FILE;
        callback(ValidationReport{issue.type, issue.id, std::string{issue.message}, fmt::format(issue.detailsFmt, std::forward<Args>(args)...)});
    }